

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees.c
# Opt level: O0

int cm_zlib__tr_tally(deflate_state *s,uint dist,uint lc)

{
  byte bVar1;
  uint uVar2;
  uint local_24;
  uint lc_local;
  uint dist_local;
  deflate_state *s_local;
  
  uVar2 = s->sym_next;
  s->sym_next = uVar2 + 1;
  s->sym_buf[uVar2] = (uchf)dist;
  uVar2 = s->sym_next;
  s->sym_next = uVar2 + 1;
  s->sym_buf[uVar2] = (uchf)(dist >> 8);
  uVar2 = s->sym_next;
  s->sym_next = uVar2 + 1;
  s->sym_buf[uVar2] = (uchf)lc;
  if (dist == 0) {
    s->dyn_ltree[lc].fc.freq = s->dyn_ltree[lc].fc.freq + 1;
  }
  else {
    s->matches = s->matches + 1;
    uVar2 = dist - 1;
    s->dyn_ltree[(int)(""[lc] + 0x101)].fc.freq = s->dyn_ltree[(int)(""[lc] + 0x101)].fc.freq + 1;
    if (uVar2 < 0x100) {
      bVar1 = ""[uVar2];
    }
    else {
      bVar1 = ""[(uVar2 >> 7) + 0x100];
    }
    local_24 = (uint)bVar1;
    s->dyn_dtree[(int)local_24].fc.freq = s->dyn_dtree[(int)local_24].fc.freq + 1;
  }
  return (int)(s->sym_next == s->sym_end);
}

Assistant:

int ZLIB_INTERNAL _tr_tally (s, dist, lc)
    deflate_state *s;
    unsigned dist;  /* distance of matched string */
    unsigned lc;    /* match length-MIN_MATCH or unmatched char (if dist==0) */
{
    s->sym_buf[s->sym_next++] = dist;
    s->sym_buf[s->sym_next++] = dist >> 8;
    s->sym_buf[s->sym_next++] = lc;
    if (dist == 0) {
        /* lc is the unmatched char */
        s->dyn_ltree[lc].Freq++;
    } else {
        s->matches++;
        /* Here, lc is the match length - MIN_MATCH */
        dist--;             /* dist = match distance - 1 */
        Assert((ush)dist < (ush)MAX_DIST(s) &&
               (ush)lc <= (ush)(MAX_MATCH-MIN_MATCH) &&
               (ush)d_code(dist) < (ush)D_CODES,  "_tr_tally: bad match");

        s->dyn_ltree[_length_code[lc]+LITERALS+1].Freq++;
        s->dyn_dtree[d_code(dist)].Freq++;
    }
    return (s->sym_next == s->sym_end);
}